

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O3

bool __thiscall AActor::IsInsideVisibleAngles(AActor *this)

{
  double dVar1;
  double dVar2;
  double y;
  double dVar3;
  bool bVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  double x;
  double dVar7;
  double dVar8;
  double y_00;
  double dVar9;
  
  bVar4 = true;
  if (((this->renderflags).Value & 0x200000) != 0) {
    bVar4 = true;
    if ((&DAT_017e1fb8)[(long)consoleplayer * 0x54] != 0) {
      if ((*(byte *)((&DAT_017e1fb8)[(long)consoleplayer * 0x54] + 0x20) & 0x20) == 0) {
        dVar7 = (this->VisibleStartAngle).Degrees;
        dVar1 = (this->VisibleEndAngle).Degrees;
        dVar8 = (this->VisibleStartPitch).Degrees;
        dVar2 = (this->VisibleEndPitch).Degrees;
        dVar9 = dVar1;
        if (dVar7 <= dVar1) {
          dVar9 = dVar7;
        }
        x = ViewPos.X - (this->__Pos).X;
        y_00 = ViewPos.Y - (this->__Pos).Y;
        y = ViewPos.Z - (this->__Pos).Z;
        dVar3 = c_atan2(y_00,x);
        dVar3 = dVar3 * 57.29577951308232;
        if (((this->renderflags).Value & 0x400000) == 0) {
          dVar3 = (double)SUB84((dVar3 - (this->Angles).Yaw.Degrees) * 11930464.711111112 +
                                6755399441055744.0,0) * 8.381903171539307e-08;
        }
        bVar4 = false;
        if (dVar9 <= dVar3) {
          if (dVar7 <= dVar1) {
            dVar7 = dVar1;
          }
          bVar4 = false;
          if (dVar3 <= dVar7) {
            uVar5 = SUB84(dVar2,0);
            uVar6 = (undefined4)((ulong)dVar2 >> 0x20);
            if (dVar8 <= dVar2) {
              uVar5 = SUB84(dVar8,0);
              uVar6 = (undefined4)((ulong)dVar8 >> 0x20);
            }
            dVar7 = c_sqrt(y_00 * y_00 + x * x);
            dVar7 = c_atan2(y,dVar7);
            dVar7 = dVar7 * 57.29577951308232;
            if (((this->renderflags).Value & 0x800000) == 0) {
              dVar7 = (double)SUB84((dVar7 - (this->Angles).Pitch.Degrees) * 11930464.711111112 +
                                    6755399441055744.0,0) * 8.381903171539307e-08;
            }
            if ((double)CONCAT44(uVar6,uVar5) <= dVar7) {
              if (dVar8 <= dVar2) {
                dVar8 = dVar2;
              }
              bVar4 = dVar7 <= dVar8;
            }
            else {
              bVar4 = false;
            }
          }
        }
      }
      else {
        (&DAT_017e1fb8)[(long)consoleplayer * 0x54] = 0;
      }
    }
  }
  return bVar4;
}

Assistant:

bool AActor::IsInsideVisibleAngles() const
{
	// Don't bother masking if not wanted.
	if (!(renderflags & RF_MASKROTATION))
		return true;

	if (players[consoleplayer].camera == nullptr)
		return true;
	
	DAngle anglestart = VisibleStartAngle;
	DAngle angleend = VisibleEndAngle;
	DAngle pitchstart = VisibleStartPitch;
	DAngle pitchend = VisibleEndPitch;
	
	if (anglestart > angleend)
	{
		DAngle temp = anglestart;
		anglestart = angleend;
		angleend = temp;
	}

	if (pitchstart > pitchend)
	{
		DAngle temp = pitchstart;
		pitchstart = pitchend;
		pitchend = temp;
	}
	

	AActor *mo = players[consoleplayer].camera;

	if (mo != nullptr)
	{
		
		DVector3 diffang = ViewPos - Pos();
		DAngle to = diffang.Angle();

		if (!(renderflags & RF_ABSMASKANGLE)) 
			to = deltaangle(Angles.Yaw, to);

		if ((to >= anglestart && to <= angleend))
		{
			to = diffang.Pitch();
			if (!(renderflags & RF_ABSMASKPITCH))
				to = deltaangle(Angles.Pitch, to);

			return !!(to >= pitchstart && to <= pitchend);
		}
		else return false;
	}
	return true;
}